

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O3

int imcomp_nullscalefloats
              (float *fdata,long tilelen,int *idata,double scale,double zero,int nullcheck,
              float nullflagval,int nullval,int *status)

{
  float fVar1;
  long lVar2;
  int iVar3;
  double dVar4;
  
  if (nullcheck == 1) {
    if (0 < tilelen) {
      lVar2 = 0;
      do {
        fVar1 = fdata[lVar2];
        if ((fVar1 != nullflagval) || (NAN(fVar1) || NAN(nullflagval))) {
          dVar4 = ((double)fVar1 - zero) / scale;
          if (-2147483648.49 <= dVar4) {
            if (dVar4 <= 2147483647.49) {
              if (0.0 <= dVar4) {
                dVar4 = dVar4 + 0.5;
              }
              else {
                dVar4 = dVar4 + -0.5;
              }
              idata[lVar2] = (int)dVar4;
            }
            else {
              *status = -0xb;
              idata[lVar2] = 0x7fffffff;
            }
          }
          else {
            *status = -0xb;
            idata[lVar2] = -0x80000000;
          }
        }
        else {
          idata[lVar2] = nullval;
        }
        lVar2 = lVar2 + 1;
      } while (tilelen != lVar2);
    }
  }
  else if (0 < tilelen) {
    lVar2 = 0;
    do {
      dVar4 = ((double)fdata[lVar2] - zero) / scale;
      if (-2147483648.49 <= dVar4) {
        if (dVar4 <= 2147483647.49) {
          if (0.0 <= dVar4) {
            dVar4 = dVar4 + 0.5;
          }
          else {
            dVar4 = dVar4 + -0.5;
          }
          iVar3 = (int)dVar4;
        }
        else {
          *status = -0xb;
          iVar3 = 0x7fffffff;
        }
      }
      else {
        *status = -0xb;
        iVar3 = -0x80000000;
      }
      idata[lVar2] = iVar3;
      lVar2 = lVar2 + 1;
    } while (tilelen != lVar2);
  }
  return *status;
}

Assistant:

int imcomp_nullscalefloats(
     float *fdata,
     long tilelen,
     int *idata, 
     double scale,
     double zero,
     int nullcheck,
     float nullflagval,
     int nullval,
     int *status)
/*
   do null value substitution  of the float array.
   If array value = nullflagval, then set the output value to FLOATNULLVALUE.
   Otherwise, inverse scale the integer value.
*/
{
    long ii;
    double dvalue;
    
    if (nullcheck == 1) /* must check for null values */
    {
      for (ii=0; ii < tilelen; ii++)
      {
        if (fdata[ii] == nullflagval)
	    idata[ii] = nullval;
	else 
	{
            dvalue = (fdata[ii] - zero) / scale;

            if (dvalue < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MIN;
            }
            else if (dvalue > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MAX;
            }
            else
            {
                if (dvalue >= 0.)
                    idata[ii] = (int) (dvalue + .5);
                else
                    idata[ii] = (int) (dvalue - .5);
            }
        }
      }
    }
    else  /* don't have to worry about null values */
    {
      for (ii=0; ii < tilelen; ii++)
      {
            dvalue = (fdata[ii] - zero) / scale;

            if (dvalue < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MIN;
            }
            else if (dvalue > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MAX;
            }
            else
            {
                if (dvalue >= 0.)
                    idata[ii] = (int) (dvalue + .5);
                else
                    idata[ii] = (int) (dvalue - .5);
            }
      }
    }
    return(*status);
}